

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring64_bitmap_t * roaring64_bitmap_portable_deserialize_safe(char *buf,size_t maxbytes)

{
  ulong uVar1;
  ushort uVar2;
  uint high_bits;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  roaring64_bitmap_t *r;
  ulong uVar6;
  size_t sVar7;
  roaring_bitmap_t *r_00;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint *buf_00;
  long lVar11;
  uint uVar12;
  ulong local_58;
  
  if (maxbytes < 8 || buf == (char *)0x0) {
    return (roaring64_bitmap_t *)0x0;
  }
  uVar4 = *(ulong *)buf;
  if (uVar4 >> 0x20 == 0) {
    r = (roaring64_bitmap_t *)(*global_memory_hook.malloc)(0xb8);
    (r->art).root = 0;
    (r->art).first_free[0] = 0;
    (r->art).first_free[1] = 0;
    (r->art).first_free[2] = 0;
    (r->art).first_free[3] = 0;
    (r->art).first_free[4] = 0;
    (r->art).first_free[5] = 0;
    (r->art).capacities[0] = 0;
    (r->art).capacities[1] = 0;
    (r->art).capacities[2] = 0;
    (r->art).capacities[3] = 0;
    (r->art).capacities[4] = 0;
    (r->art).capacities[5] = 0;
    (r->art).nodes[1] = (art_node_t *)0x0;
    (r->art).nodes[2] = (art_node_t *)0x0;
    (r->art).nodes[3] = (art_node_t *)0x0;
    (r->art).nodes[4] = (art_node_t *)0x0;
    *(undefined8 *)((long)(r->art).nodes + 0x21) = 0;
    *(undefined8 *)((long)(r->art).nodes + 0x29) = 0;
    r->first_free = 0;
    r->capacity = 0;
    r->containers = (container_t **)0x0;
    if (uVar4 != 0) {
      buf_00 = (uint *)(buf + 8);
      uVar10 = 0xffffffffffffffff;
      local_58 = 8;
      uVar9 = 0;
      do {
        uVar1 = local_58 + 4;
        if (maxbytes < uVar1) {
          roaring64_bitmap_free(r);
          bVar5 = false;
        }
        else {
          high_bits = *buf_00;
          uVar6 = (ulong)high_bits;
          buf_00 = buf_00 + 1;
          local_58 = uVar1;
          if ((long)uVar10 < (long)uVar6) {
            sVar7 = ra_portable_deserialize_size((char *)buf_00,maxbytes - uVar1);
            uVar10 = uVar6;
            if ((sVar7 == 0) ||
               (r_00 = roaring_bitmap_portable_deserialize_safe((char *)buf_00,maxbytes - uVar1),
               r_00 == (roaring_bitmap_t *)0x0)) {
              roaring64_bitmap_free(r);
LAB_00129f5c:
              bVar5 = false;
            }
            else {
              buf_00 = (uint *)((long)buf_00 + sVar7);
              local_58 = uVar1 + sVar7;
              iVar3 = (r_00->high_low_container).size;
              bVar5 = 0 < iVar3;
              if (0 < iVar3) {
                lVar11 = 0;
                uVar12 = 0xffffffff;
                do {
                  uVar2 = (r_00->high_low_container).keys[lVar11];
                  if ((int)(uint)uVar2 <= (int)uVar12) {
                    roaring_bitmap_free(r_00);
                    roaring64_bitmap_free(r);
                    if (bVar5) goto LAB_00129f5c;
                    break;
                  }
                  lVar11 = lVar11 + 1;
                  lVar8 = (long)(r_00->high_low_container).size;
                  bVar5 = lVar11 < lVar8;
                  uVar12 = (uint)uVar2;
                } while (lVar11 < lVar8);
              }
              move_from_roaring32_offset(r,r_00,high_bits);
              roaring_bitmap_free(r_00);
              bVar5 = true;
            }
          }
          else {
            roaring64_bitmap_free(r);
            bVar5 = false;
          }
        }
        if (!bVar5) goto LAB_00129dec;
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar4);
    }
  }
  else {
LAB_00129dec:
    r = (roaring64_bitmap_t *)0x0;
  }
  return r;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_portable_deserialize_safe(
    const char *buf, size_t maxbytes) {
    // https://github.com/RoaringBitmap/RoaringFormatSpec#extension-for-64-bit-implementations
    if (buf == NULL) {
        return NULL;
    }
    size_t read_bytes = 0;

    // Read as uint64 the distinct number of "buckets", where a bucket is
    // defined as the most significant 32 bits of an element.
    uint64_t buckets;
    if (read_bytes + sizeof(buckets) > maxbytes) {
        return NULL;
    }
    memcpy(&buckets, buf, sizeof(buckets));
    buf += sizeof(buckets);
    read_bytes += sizeof(buckets);

    // Buckets should be 32 bits with 4 bits of zero padding.
    if (buckets > UINT32_MAX) {
        return NULL;
    }

    roaring64_bitmap_t *r = roaring64_bitmap_create();
    // Iterate through buckets ordered by increasing keys.
    int64_t previous_high32 = -1;
    for (uint64_t bucket = 0; bucket < buckets; ++bucket) {
        // Read as uint32 the most significant 32 bits of the bucket.
        uint32_t high32;
        if (read_bytes + sizeof(high32) > maxbytes) {
            roaring64_bitmap_free(r);
            return NULL;
        }
        memcpy(&high32, buf, sizeof(high32));
        buf += sizeof(high32);
        read_bytes += sizeof(high32);
        // High 32 bits must be strictly increasing.
        if (high32 <= previous_high32) {
            roaring64_bitmap_free(r);
            return NULL;
        }
        previous_high32 = high32;

        // Read the 32-bit Roaring bitmaps representing the least
        // significant bits of a set of elements.
        size_t bitmap32_size = roaring_bitmap_portable_deserialize_size(
            buf, maxbytes - read_bytes);
        if (bitmap32_size == 0) {
            roaring64_bitmap_free(r);
            return NULL;
        }

        roaring_bitmap_t *bitmap32 = roaring_bitmap_portable_deserialize_safe(
            buf, maxbytes - read_bytes);
        if (bitmap32 == NULL) {
            roaring64_bitmap_free(r);
            return NULL;
        }
        buf += bitmap32_size;
        read_bytes += bitmap32_size;

        // While we don't attempt to validate much, we must ensure that there
        // is no duplication in the high 48 bits - inserting into the ART
        // assumes (or UB) no duplicate keys. The top 32 bits must be unique
        // because we check for strict increasing values of  high32, but we
        // must also ensure the top 16 bits within each 32-bit bitmap are also
        // at least unique (we ensure they're strictly increasing as well,
        // which they must be for a _valid_ bitmap, since it's cheaper to check)
        int32_t last_bitmap_key = -1;
        for (int i = 0; i < bitmap32->high_low_container.size; i++) {
            uint16_t key = bitmap32->high_low_container.keys[i];
            if (key <= last_bitmap_key) {
                roaring_bitmap_free(bitmap32);
                roaring64_bitmap_free(r);
                return NULL;
            }
            last_bitmap_key = key;
        }

        // Insert all containers of the 32-bit bitmap into the 64-bit bitmap.
        move_from_roaring32_offset(r, bitmap32, high32);
        roaring_bitmap_free(bitmap32);
    }
    return r;
}